

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc.c
# Opt level: O1

void lowmc_record_state(lowmc_parameters_t *lowmc,lowmc_key_t *key,mzd_local_t *x,
                       recorded_state_t *state)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  recorded_state_t *prVar7;
  mzd_local_t *pmVar8;
  ulong uVar9;
  long lVar10;
  lowmc_partial_round_t *plVar11;
  uint i;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  mzd_local_t y [1];
  mzd_local_t y_2 [1];
  mzd_local_t x_1 [1];
  mzd_local_t local_160;
  lowmc_key_t *local_128;
  mzd_local_t local_120;
  undefined1 local_100 [72];
  ulong local_b8;
  ulong local_90;
  ulong local_70;
  
  uVar4 = (uint)lowmc->m | (uint)lowmc->n << 0x10;
  if ((~DAT_0019608c & 0x20400) != 0) {
    if ((int)uVar4 < 0xc00040) {
      if (uVar4 == 0x80000a) {
        mzd_xor_s128_128(&local_160,x,precomputed_constant_linear_part);
        plVar11 = rounds;
        mzd_addmul_v_s128_128(&local_160,key,precomputed_round_key_matrix_linear_part);
        mzd_mul_v_s128_128_640
                  ((mzd_local_t *)local_100,key,precomputed_round_key_matrix_non_linear_part);
        mzd_xor_s128_640((mzd_local_t *)local_100,(mzd_local_t *)local_100,
                         precomputed_constant_non_linear_part);
        lVar10 = 0;
        uVar12 = 0;
        do {
          mzd_copy_s128_128((mzd_local_t *)((long)state->state[0].w64 + lVar10),&local_160);
          uVar5 = local_160.w64[1] * 4;
          uVar6 = local_160.w64[1] * 2 & 0x9249249000000000;
          uVar9 = local_160.w64[1] & 0x9249249000000000;
          local_160.w64[1] =
               *(long *)(local_100 +
                        (ulong)((uint)uVar12 & 6) * 4 + (uVar12 >> 3 & 0x1fffffff) * 0x20) <<
               (~(byte)lVar10 & 0x20) & 0xffffffff00000000U ^
               (uVar6 ^ 0x9249249000000000) & uVar5 ^ uVar9 ^ uVar6 ^
               (((uVar9 ^ 0x9249249000000000) & uVar5 ^ uVar6) >> 1 |
               (local_160.w64[1] * 2 & uVar9 ^ uVar5 & 0x9249249000000000) >> 2 |
               local_160.w64[1] & 0x3ffffffff);
          mzd_mul_v_parity_uint64_128_30(&local_120,&local_160,plVar11->z_matrix);
          mzd_shuffle_128_30(&local_160,plVar11->r_mask);
          mzd_addmul_v_s128_30_128(&local_120,&local_160,plVar11->r_matrix);
          local_160.w64[1] = local_160.w64[1] & 0x3ffffffff;
          mzd_xor_s128_128(&local_160,&local_120,&local_160);
          uVar12 = uVar12 + 1;
          plVar11 = plVar11 + 1;
          lVar10 = lVar10 + 0x20;
        } while (uVar12 != 0x13);
        mzd_copy_s128_128(state[0x13].state,&local_160);
        uVar12 = local_160.w64[1] * 4;
        uVar5 = local_160.w64[1] * 2 & 0x9249249000000000;
        uVar6 = local_160.w64[1] & 0x9249249000000000;
        local_160.w64[1] =
             local_b8 & 0xffffffff00000000 ^
             (uVar5 ^ 0x9249249000000000) & uVar12 ^ uVar6 ^ uVar5 ^
             (((uVar6 ^ 0x9249249000000000) & uVar12 ^ uVar5) >> 1 |
             (local_160.w64[1] * 2 & uVar6 ^ uVar12 & 0x9249249000000000) >> 2 |
             local_160.w64[1] & 0x3ffffffff);
        mzd_mul_v_s128_128(&local_120,&local_160,Z_r);
        mzd_copy_s128_128(&local_160,&local_120);
        mzd_copy_s128_128(state[0x14].state,&local_160);
        return;
      }
      if (uVar4 != 0x81002b) {
        mzd_xor_s128_256(&local_160,x,precomputed_constant_linear_part);
        plVar11 = rounds;
        mzd_addmul_v_s128_192(&local_160,key,precomputed_round_key_matrix_linear_part);
        mzd_mul_v_s128_192_1024
                  ((mzd_local_t *)local_100,key,precomputed_round_key_matrix_non_linear_part);
        mzd_xor_s128_1024((mzd_local_t *)local_100,(mzd_local_t *)local_100,
                          precomputed_constant_non_linear_part);
        lVar10 = 0;
        uVar12 = 0;
        do {
          mzd_copy_s128_256((mzd_local_t *)((long)state->state[0].w64 + lVar10),&local_160);
          uVar5 = local_160.w64[2] * 4;
          uVar6 = local_160.w64[2] * 2 & 0x9249249000000000;
          uVar9 = local_160.w64[2] & 0x9249249000000000;
          local_160.w64[2] =
               *(long *)(local_100 +
                        (ulong)((uint)uVar12 & 6) * 4 + (uVar12 >> 3 & 0x1fffffff) * 0x20) <<
               (~(byte)lVar10 & 0x20) & 0xffffffff00000000U ^
               (uVar6 ^ 0x9249249000000000) & uVar5 ^ uVar9 ^ uVar6 ^
               (((uVar9 ^ 0x9249249000000000) & uVar5 ^ uVar6) >> 1 |
               (local_160.w64[2] * 2 & uVar9 ^ uVar5 & 0x9249249000000000) >> 2 |
               local_160.w64[2] & 0x3ffffffff);
          mzd_mul_v_parity_uint64_192_30(&local_120,&local_160,plVar11->z_matrix);
          mzd_shuffle_192_30(&local_160,plVar11->r_mask);
          mzd_addmul_v_s128_30_192(&local_120,&local_160,plVar11->r_matrix);
          local_160.w64[2] = local_160.w64[2] & 0x3ffffffff;
          mzd_xor_s128_256(&local_160,&local_120,&local_160);
          uVar12 = uVar12 + 1;
          plVar11 = plVar11 + 1;
          lVar10 = lVar10 + 0x20;
        } while (uVar12 != 0x1d);
        mzd_copy_s128_256(state[0x1d].state,&local_160);
        uVar12 = local_160.w64[2] * 4;
        uVar5 = local_160.w64[2] * 2 & 0x9249249000000000;
        uVar6 = local_160.w64[2] & 0x9249249000000000;
        local_160.w64[2] =
             local_90 & 0xffffffff00000000 ^
             (uVar5 ^ 0x9249249000000000) & uVar12 ^ uVar6 ^ uVar5 ^
             (((uVar6 ^ 0x9249249000000000) & uVar12 ^ uVar5) >> 1 |
             (local_160.w64[2] * 2 & uVar6 ^ uVar12 & 0x9249249000000000) >> 2 |
             local_160.w64[2] & 0x3ffffffff);
        mzd_mul_v_s128_192(&local_120,&local_160,Z_r);
        mzd_copy_s128_256(&local_160,&local_120);
        prVar7 = state + 0x1e;
LAB_001079ba:
        pmVar8 = &local_160;
        goto LAB_001079c0;
      }
      mzd_copy_s128_256((mzd_local_t *)local_100,x);
      mzd_addmul_v_s128_129((mzd_local_t *)local_100,key,K_0);
      lVar10 = 0;
      local_128 = key;
      do {
        mzd_copy_s128_256((mzd_local_t *)((long)state->state[0].w64 + lVar10),
                          (mzd_local_t *)local_100);
        auVar19 = vandpd_avx(local_100._0_16_,_DAT_0010d7e0);
        auVar13 = vpand_avx(local_100._16_16_,_DAT_0010d7f0);
        auVar24 = vandpd_avx(local_100._0_16_,_DAT_0010d800);
        auVar14 = vpand_avx(local_100._16_16_,_DAT_0010d810);
        auVar1 = vandpd_avx(local_100._0_16_,_DAT_0010d820);
        auVar2 = vpand_avx(local_100._16_16_,_DAT_0010d830);
        auVar23 = vpsrldq_avx(auVar19,8);
        auVar13 = vpshldq_avx512_vbmi2(auVar13,auVar23,2);
        auVar23 = vpslldq_avx(auVar19,8);
        auVar23 = vpshldq_avx512_vbmi2(auVar19,auVar23,2);
        auVar19 = vpsrldq_avx(local_100._0_16_,8);
        auVar14 = vpshldq_avx512_vbmi2(auVar14,auVar19,1);
        auVar19 = vpaddq_avx(auVar24,auVar24);
        auVar15 = vpternlogq_avx512vl(auVar23,auVar19,auVar1,0x78);
        auVar16 = vpternlogq_avx512vl(auVar14,auVar2,auVar13,0xd2);
        auVar24 = vpsrlq_avx(auVar16,1);
        auVar17 = vpternlogq_avx512vl(auVar24,auVar14,auVar13,0x1e);
        auVar13 = vpternlogq_avx512vl(auVar13,auVar14,auVar2,0x78);
        auVar24 = vpor_avx(auVar19,auVar23);
        auVar14 = vpternlogq_avx512vl(auVar19,auVar1,auVar23,0xd2);
        auVar19 = vpslldq_avx(auVar13,8);
        auVar25 = vpsllq_avx(auVar19,0x3e);
        auVar19 = vpsrldq_avx(auVar15,8);
        auVar19 = vpshldq_avx512_vbmi2(auVar19,auVar15,0x3e);
        auVar19 = vpor_avx(auVar25,auVar19);
        auVar15 = vpsrlq_avx(auVar13,2);
        auVar13 = vpslldq_avx(auVar16,8);
        auVar16 = vpsllq_avx(auVar13,0x3f);
        auVar13 = vpsrldq_avx(auVar23,8);
        auVar13 = vpshldq_avx512_vbmi2(auVar13,auVar14,0x3f);
        auVar24 = vpternlogq_avx512vl(auVar13,auVar24,auVar16,0x36);
        local_100._0_16_ = vpternlogq_avx512vl(auVar24,auVar1,auVar19,0x96);
        local_100._16_16_ = vpternlogq_avx512vl(auVar17,auVar2,auVar15,0x96);
        mzd_mul_v_s128_129(&local_160,(mzd_local_t *)local_100,
                           *(mzd_local_t **)((long)&rounds[0].l_matrix + lVar10));
        mzd_xor_s128_256((mzd_local_t *)local_100,&local_160,
                         *(mzd_local_t **)((long)&rounds[0].constant + lVar10));
        mzd_addmul_v_s128_129
                  ((mzd_local_t *)local_100,local_128,
                   *(mzd_local_t **)((long)&rounds[0].k_matrix + lVar10));
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0x80);
    }
    else {
      if (uVar4 == 0xc00040) {
        mzd_copy_s128_256((mzd_local_t *)local_100,x);
        mzd_addmul_v_s128_192((mzd_local_t *)local_100,key,K_0);
        lVar10 = 0;
        do {
          mzd_copy_s128_256((mzd_local_t *)((long)state->state[0].w64 + lVar10),
                            (mzd_local_t *)local_100);
          auVar19 = vandpd_avx(local_100._0_16_,_DAT_0010d840);
          auVar13 = vpand_avx(local_100._16_16_,_DAT_0010d7f0);
          auVar24 = vandpd_avx(local_100._0_16_,_DAT_0010d850);
          auVar14 = vpand_avx(local_100._16_16_,_DAT_0010d810);
          auVar1 = vandpd_avx(local_100._0_16_,_DAT_0010d860);
          auVar2 = vpand_avx(local_100._16_16_,_DAT_0010d830);
          auVar23 = vpsrldq_avx(auVar19,8);
          auVar13 = vpshldq_avx512_vbmi2(auVar13,auVar23,2);
          auVar23 = vpslldq_avx(auVar19,8);
          auVar23 = vpshldq_avx512_vbmi2(auVar19,auVar23,2);
          auVar19 = vpsrldq_avx(local_100._0_16_,8);
          auVar14 = vpshldq_avx512_vbmi2(auVar14,auVar19,1);
          auVar19 = vpaddq_avx(auVar24,auVar24);
          auVar15 = vpternlogq_avx512vl(auVar23,auVar19,auVar1,0x78);
          auVar16 = vpternlogq_avx512vl(auVar14,auVar2,auVar13,0xd2);
          auVar24 = vpsrlq_avx(auVar16,1);
          auVar17 = vpternlogq_avx512vl(auVar24,auVar14,auVar13,0x1e);
          auVar13 = vpternlogq_avx512vl(auVar13,auVar14,auVar2,0x78);
          auVar24 = vpor_avx(auVar19,auVar23);
          auVar14 = vpternlogq_avx512vl(auVar19,auVar1,auVar23,0xd2);
          auVar19 = vpslldq_avx(auVar13,8);
          auVar25 = vpsllq_avx(auVar19,0x3e);
          auVar19 = vpsrldq_avx(auVar15,8);
          auVar19 = vpshldq_avx512_vbmi2(auVar19,auVar15,0x3e);
          auVar19 = vpor_avx(auVar25,auVar19);
          auVar15 = vpsrlq_avx(auVar13,2);
          auVar13 = vpslldq_avx(auVar16,8);
          auVar16 = vpsllq_avx(auVar13,0x3f);
          auVar13 = vpsrldq_avx(auVar23,8);
          auVar13 = vpshldq_avx512_vbmi2(auVar13,auVar14,0x3f);
          auVar24 = vpternlogq_avx512vl(auVar13,auVar24,auVar16,0x36);
          local_100._0_16_ = vpternlogq_avx512vl(auVar24,auVar1,auVar19,0x96);
          local_100._16_16_ = vpternlogq_avx512vl(auVar17,auVar2,auVar15,0x96);
          mzd_mul_v_s128_192(&local_160,(mzd_local_t *)local_100,
                             *(mzd_local_t **)((long)&rounds[0].l_matrix + lVar10));
          mzd_xor_s128_256((mzd_local_t *)local_100,&local_160,
                           *(mzd_local_t **)((long)&rounds[0].constant + lVar10));
          mzd_addmul_v_s128_192
                    ((mzd_local_t *)local_100,key,
                     *(mzd_local_t **)((long)&rounds[0].k_matrix + lVar10));
          lVar10 = lVar10 + 0x20;
        } while (lVar10 != 0x80);
        prVar7 = state + 4;
        pmVar8 = (mzd_local_t *)local_100;
        goto LAB_001079c0;
      }
      if (uVar4 != 0xff0055) {
        mzd_xor_s128_256(&local_160,x,precomputed_constant_linear_part);
        plVar11 = rounds;
        mzd_addmul_v_s128_256(&local_160,key,precomputed_round_key_matrix_linear_part);
        mzd_mul_v_s128_256_1280
                  ((mzd_local_t *)local_100,key,precomputed_round_key_matrix_non_linear_part);
        mzd_xor_s128_1280((mzd_local_t *)local_100,(mzd_local_t *)local_100,
                          precomputed_constant_non_linear_part);
        lVar10 = 0;
        uVar12 = 0;
        do {
          mzd_copy_s128_256((mzd_local_t *)((long)state->state[0].w64 + lVar10),&local_160);
          uVar5 = local_160.w64[3] * 4;
          uVar6 = local_160.w64[3] * 2 & 0x9249249000000000;
          uVar9 = local_160.w64[3] & 0x9249249000000000;
          local_160.w64[3] =
               *(long *)(local_100 +
                        (ulong)((uint)uVar12 & 6) * 4 + (uVar12 >> 3 & 0x1fffffff) * 0x20) <<
               (~(byte)lVar10 & 0x20) & 0xffffffff00000000U ^
               (uVar6 ^ 0x9249249000000000) & uVar5 ^ uVar9 ^ uVar6 ^
               (((uVar9 ^ 0x9249249000000000) & uVar5 ^ uVar6) >> 1 |
               (local_160.w64[3] * 2 & uVar9 ^ uVar5 & 0x9249249000000000) >> 2 |
               local_160.w64[3] & 0x3ffffffff);
          mzd_mul_v_parity_uint64_256_30(&local_120,&local_160,plVar11->z_matrix);
          mzd_shuffle_256_30(&local_160,plVar11->r_mask);
          mzd_addmul_v_s128_30_256(&local_120,&local_160,plVar11->r_matrix);
          local_160.w64[3] = local_160.w64[3] & 0x3ffffffff;
          mzd_xor_s128_256(&local_160,&local_120,&local_160);
          uVar12 = uVar12 + 1;
          plVar11 = plVar11 + 1;
          lVar10 = lVar10 + 0x20;
        } while (uVar12 != 0x25);
        mzd_copy_s128_256(state[0x25].state,&local_160);
        uVar12 = local_160.w64[3] * 4;
        uVar5 = local_160.w64[3] * 2 & 0x9249249000000000;
        uVar6 = local_160.w64[3] & 0x9249249000000000;
        local_160.w64[3] =
             local_70 & 0xffffffff00000000 ^
             (uVar5 ^ 0x9249249000000000) & uVar12 ^ uVar6 ^ uVar5 ^
             (((uVar6 ^ 0x9249249000000000) & uVar12 ^ uVar5) >> 1 |
             (local_160.w64[3] * 2 & uVar6 ^ uVar12 & 0x9249249000000000) >> 2 |
             local_160.w64[3] & 0x3ffffffff);
        mzd_mul_v_s128_256(&local_120,&local_160,Z_r);
        mzd_copy_s128_256(&local_160,&local_120);
        prVar7 = state + 0x26;
        goto LAB_001079ba;
      }
      mzd_copy_s128_256((mzd_local_t *)local_100,x);
      mzd_addmul_v_s128_256((mzd_local_t *)local_100,key,K_0);
      lVar10 = 0;
      local_128 = key;
      do {
        mzd_copy_s128_256((mzd_local_t *)((long)state->state[0].w64 + lVar10),
                          (mzd_local_t *)local_100);
        auVar19 = vandpd_avx(local_100._0_16_,_DAT_0010d850);
        auVar24 = vandpd_avx(local_100._16_16_,_DAT_0010d860);
        auVar1 = vandpd_avx(local_100._0_16_,_DAT_0010d860);
        auVar13 = vandpd_avx(local_100._16_16_,_DAT_0010d840);
        auVar14 = vandpd_avx(local_100._0_16_,_DAT_0010d870);
        auVar2 = vandpd_avx(local_100._16_16_,_DAT_0010d850);
        auVar23 = vpsrldq_avx(auVar19,8);
        auVar23 = vpsrlq_avx(auVar23,0x3e);
        auVar16 = vpsllq_avx(auVar19,2);
        auVar19 = vpslldq_avx(auVar24,8);
        auVar19 = vpshldq_avx512_vbmi2(auVar24,auVar19,2);
        auVar23 = vpor_avx(auVar19,auVar23);
        auVar24 = vpaddq_avx(auVar1,auVar1);
        auVar19 = vpslldq_avx(local_100._16_16_,8);
        auVar15 = vpshldq_avx512_vbmi2(auVar13,auVar19,1);
        auVar19 = vandnpd_avx(auVar14,auVar16);
        auVar13 = vpor_avx(auVar24,auVar16);
        auVar24 = vpternlogq_avx512vl(auVar16,auVar24,auVar14,0x78);
        auVar16 = vpternlogq_avx512vl(auVar15,auVar2,auVar23,0xd2);
        auVar17 = vpsrldq_avx(auVar16,8);
        auVar16 = vpshldq_avx512_vbmi2(auVar17,auVar16,0x3f);
        auVar16 = vpternlogq_avx512vl(auVar16,auVar15,auVar23,0x1e);
        auVar23 = vpternlogq_avx512vl(auVar23,auVar15,auVar2,0x78);
        auVar15 = vpslldq_avx(auVar23,8);
        auVar24 = vpshldq_avx512_vbmi2(auVar15,auVar24,0x3e);
        auVar15 = vpsrldq_avx(auVar23,8);
        auVar23 = vpshldq_avx512_vbmi2(auVar15,auVar23,0x3e);
        auVar19 = vpsrlq_avx(auVar19,1);
        auVar19 = vpternlogq_avx512vl(auVar19,auVar13,auVar1,0x96);
        local_100._0_16_ = vpternlogq_avx512vl(auVar19,auVar14,auVar24,0x96);
        local_100._16_16_ = vpternlogq_avx512vl(auVar16,auVar2,auVar23,0x96);
        mzd_mul_v_s128_256(&local_160,(mzd_local_t *)local_100,
                           *(mzd_local_t **)((long)&rounds[0].l_matrix + lVar10));
        mzd_xor_s128_256((mzd_local_t *)local_100,&local_160,
                         *(mzd_local_t **)((long)&rounds[0].constant + lVar10));
        mzd_addmul_v_s128_256
                  ((mzd_local_t *)local_100,local_128,
                   *(mzd_local_t **)((long)&rounds[0].k_matrix + lVar10));
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0x80);
    }
    prVar7 = state + 4;
    pmVar8 = (mzd_local_t *)local_100;
LAB_001079c0:
    mzd_copy_s128_256(prVar7->state,pmVar8);
    return;
  }
  if ((int)uVar4 < 0xc00040) {
    if (uVar4 == 0x80000a) {
      mzd_xor_s256_128(&local_160,x,precomputed_constant_linear_part);
      plVar11 = rounds;
      mzd_addmul_v_s256_128(&local_160,key,precomputed_round_key_matrix_linear_part);
      mzd_mul_v_s256_128_768
                ((mzd_local_t *)local_100,key,precomputed_round_key_matrix_non_linear_part);
      mzd_xor_s256_768((mzd_local_t *)local_100,(mzd_local_t *)local_100,
                       precomputed_constant_non_linear_part);
      lVar10 = 0;
      uVar12 = 0;
      do {
        mzd_copy_s256_128((mzd_local_t *)((long)state->state[0].w64 + lVar10),&local_160);
        uVar5 = local_160.w64[1] * 4;
        uVar6 = local_160.w64[1] * 2 & 0x9249249000000000;
        uVar9 = local_160.w64[1] & 0x9249249000000000;
        local_160.w64[1] =
             *(long *)(local_100 + (ulong)((uint)uVar12 & 6) * 4 + (uVar12 >> 3 & 0x1fffffff) * 0x20
                      ) << (~(byte)lVar10 & 0x20) & 0xffffffff00000000U ^
             (uVar6 ^ 0x9249249000000000) & uVar5 ^ uVar9 ^ uVar6 ^
             (((uVar9 ^ 0x9249249000000000) & uVar5 ^ uVar6) >> 1 |
             (local_160.w64[1] * 2 & uVar9 ^ uVar5 & 0x9249249000000000) >> 2 |
             local_160.w64[1] & 0x3ffffffff);
        mzd_mul_v_parity_uint64_128_30(&local_120,&local_160,plVar11->z_matrix);
        mzd_shuffle_pext_128_30(&local_160,plVar11->r_mask);
        mzd_addmul_v_s256_30_128(&local_120,&local_160,plVar11->r_matrix);
        local_160.w64[1] = local_160.w64[1] & 0x3ffffffff;
        mzd_xor_s256_128(&local_160,&local_120,&local_160);
        uVar12 = uVar12 + 1;
        plVar11 = plVar11 + 1;
        lVar10 = lVar10 + 0x20;
      } while (uVar12 != 0x13);
      mzd_copy_s256_128(state[0x13].state,&local_160);
      uVar12 = local_160.w64[1] * 4;
      uVar5 = local_160.w64[1] * 2 & 0x9249249000000000;
      uVar6 = local_160.w64[1] & 0x9249249000000000;
      local_160.w64[1] =
           local_b8 & 0xffffffff00000000 ^
           (uVar5 ^ 0x9249249000000000) & uVar12 ^ uVar6 ^ uVar5 ^
           (((uVar6 ^ 0x9249249000000000) & uVar12 ^ uVar5) >> 1 |
           (local_160.w64[1] * 2 & uVar6 ^ uVar12 & 0x9249249000000000) >> 2 |
           local_160.w64[1] & 0x3ffffffff);
      mzd_mul_v_s256_128(&local_120,&local_160,Z_r);
      mzd_copy_s256_128(&local_160,&local_120);
      mzd_copy_s256_128(state[0x14].state,&local_160);
      return;
    }
    if (uVar4 != 0x81002b) {
      mzd_xor_s256_256(&local_160,x,precomputed_constant_linear_part);
      plVar11 = rounds;
      mzd_addmul_v_s256_192(&local_160,key,precomputed_round_key_matrix_linear_part);
      mzd_mul_v_s256_192_1024
                ((mzd_local_t *)local_100,key,precomputed_round_key_matrix_non_linear_part);
      mzd_xor_s256_1024((mzd_local_t *)local_100,(mzd_local_t *)local_100,
                        precomputed_constant_non_linear_part);
      lVar10 = 0;
      uVar12 = 0;
      do {
        mzd_copy_s256_256((mzd_local_t *)((long)state->state[0].w64 + lVar10),&local_160);
        uVar5 = local_160.w64[2] * 4;
        uVar6 = local_160.w64[2] * 2 & 0x9249249000000000;
        uVar9 = local_160.w64[2] & 0x9249249000000000;
        local_160.w64[2] =
             *(long *)(local_100 + (ulong)((uint)uVar12 & 6) * 4 + (uVar12 >> 3 & 0x1fffffff) * 0x20
                      ) << (~(byte)lVar10 & 0x20) & 0xffffffff00000000U ^
             (uVar6 ^ 0x9249249000000000) & uVar5 ^ uVar9 ^ uVar6 ^
             (((uVar9 ^ 0x9249249000000000) & uVar5 ^ uVar6) >> 1 |
             (local_160.w64[2] * 2 & uVar9 ^ uVar5 & 0x9249249000000000) >> 2 |
             local_160.w64[2] & 0x3ffffffff);
        mzd_mul_v_parity_uint64_192_30(&local_120,&local_160,plVar11->z_matrix);
        mzd_shuffle_pext_192_30(&local_160,plVar11->r_mask);
        mzd_addmul_v_s256_30_192(&local_120,&local_160,plVar11->r_matrix);
        local_160.w64[2] = local_160.w64[2] & 0x3ffffffff;
        mzd_xor_s256_256(&local_160,&local_120,&local_160);
        uVar12 = uVar12 + 1;
        plVar11 = plVar11 + 1;
        lVar10 = lVar10 + 0x20;
      } while (uVar12 != 0x1d);
      mzd_copy_s256_256(state[0x1d].state,&local_160);
      uVar12 = local_160.w64[2] * 4;
      uVar5 = local_160.w64[2] * 2 & 0x9249249000000000;
      uVar6 = local_160.w64[2] & 0x9249249000000000;
      local_160.w64[2] =
           local_90 & 0xffffffff00000000 ^
           (uVar5 ^ 0x9249249000000000) & uVar12 ^ uVar6 ^ uVar5 ^
           (((uVar6 ^ 0x9249249000000000) & uVar12 ^ uVar5) >> 1 |
           (local_160.w64[2] * 2 & uVar6 ^ uVar12 & 0x9249249000000000) >> 2 |
           local_160.w64[2] & 0x3ffffffff);
      mzd_mul_v_s256_192(&local_120,&local_160,Z_r);
      mzd_copy_s256_256(&local_160,&local_120);
      prVar7 = state + 0x1e;
LAB_0010776c:
      pmVar8 = &local_160;
      goto LAB_00107772;
    }
    mzd_copy_s256_256((mzd_local_t *)local_100,x);
    mzd_addmul_v_s256_129((mzd_local_t *)local_100,key,K_0);
    lVar10 = 0;
    local_128 = key;
    do {
      mzd_copy_s256_256((mzd_local_t *)((long)state->state[0].w64 + lVar10),(mzd_local_t *)local_100
                       );
      auVar20 = vpand_avx2(local_100._0_32_,_DAT_0010d6a0);
      auVar21 = vpand_avx2(local_100._0_32_,_DAT_0010d6c0);
      auVar3 = vpand_avx2(local_100._0_32_,_DAT_0010d6e0);
      auVar22 = vpsllq_avx2(auVar20,2);
      auVar20 = vpsrlq_avx2(auVar20,0x3e);
      auVar20 = vpermq_avx2(auVar20,0x93);
      auVar22 = vpor_avx2(auVar20,auVar22);
      auVar20 = vpaddq_avx2(auVar21,auVar21);
      auVar21 = vpsrlq_avx2(auVar21,0x3f);
      auVar21 = vpermq_avx2(auVar21,0x93);
      auVar21 = vpor_avx2(auVar21,auVar20);
      auVar20 = vpand_avx2(auVar22,auVar3);
      auVar18 = vpternlogq_avx512vl(auVar20,auVar21,auVar22,0x96);
      auVar20 = vpor_avx2(auVar22,auVar21);
      auVar21 = vpternlogq_avx512vl(auVar22,auVar21,auVar3,0x78);
      auVar22 = vpsrlq_avx2(auVar21,2);
      auVar21 = vpsllq_avx2(auVar21,0x3e);
      auVar21 = vpermq_avx2(auVar21,0x39);
      auVar21 = vpternlogq_avx512vl(auVar21,auVar20,auVar22,0x36);
      auVar22 = vpsrlq_avx2(auVar18,1);
      auVar20 = vpsllq_avx2(auVar18,0x3f);
      auVar20 = vpermq_avx2(auVar20,0x39);
      auVar20 = vpor_avx2(auVar20,auVar22);
      local_100._0_32_ = vpternlogq_avx512vl(auVar20,auVar3,auVar21,0x96);
      mzd_mul_v_s256_129(&local_160,(mzd_local_t *)local_100,
                         *(mzd_local_t **)((long)&rounds[0].l_matrix + lVar10));
      mzd_xor_s256_256((mzd_local_t *)local_100,&local_160,
                       *(mzd_local_t **)((long)&rounds[0].constant + lVar10));
      mzd_addmul_v_s256_129
                ((mzd_local_t *)local_100,local_128,
                 *(mzd_local_t **)((long)&rounds[0].k_matrix + lVar10));
      lVar10 = lVar10 + 0x20;
    } while (lVar10 != 0x80);
  }
  else if (uVar4 == 0xc00040) {
    mzd_copy_s256_256((mzd_local_t *)local_100,x);
    local_128 = key;
    mzd_addmul_v_s256_192((mzd_local_t *)local_100,key,K_0);
    lVar10 = 0;
    do {
      mzd_copy_s256_256((mzd_local_t *)((long)state->state[0].w64 + lVar10),(mzd_local_t *)local_100
                       );
      auVar20 = vpand_avx2(local_100._0_32_,_DAT_0010d700);
      auVar21 = vpand_avx2(local_100._0_32_,_DAT_0010d720);
      auVar3 = vpand_avx2(local_100._0_32_,_DAT_0010d740);
      auVar22 = vpsllq_avx2(auVar20,2);
      auVar20 = vpsrlq_avx2(auVar20,0x3e);
      auVar20 = vpermq_avx2(auVar20,0x93);
      auVar22 = vpor_avx2(auVar20,auVar22);
      auVar20 = vpaddq_avx2(auVar21,auVar21);
      auVar21 = vpsrlq_avx2(auVar21,0x3f);
      auVar21 = vpermq_avx2(auVar21,0x93);
      auVar21 = vpor_avx2(auVar21,auVar20);
      auVar20 = vpand_avx2(auVar22,auVar3);
      auVar18 = vpternlogq_avx512vl(auVar20,auVar21,auVar22,0x96);
      auVar20 = vpor_avx2(auVar22,auVar21);
      auVar21 = vpternlogq_avx512vl(auVar22,auVar21,auVar3,0x78);
      auVar22 = vpsrlq_avx2(auVar21,2);
      auVar21 = vpsllq_avx2(auVar21,0x3e);
      auVar21 = vpermq_avx2(auVar21,0x39);
      auVar21 = vpternlogq_avx512vl(auVar21,auVar20,auVar22,0x36);
      auVar22 = vpsrlq_avx2(auVar18,1);
      auVar20 = vpsllq_avx2(auVar18,0x3f);
      auVar20 = vpermq_avx2(auVar20,0x39);
      auVar20 = vpor_avx2(auVar20,auVar22);
      local_100._0_32_ = vpternlogq_avx512vl(auVar20,auVar3,auVar21,0x96);
      mzd_mul_v_s256_192(&local_160,(mzd_local_t *)local_100,
                         *(mzd_local_t **)((long)&rounds[0].l_matrix + lVar10));
      mzd_xor_s256_256((mzd_local_t *)local_100,&local_160,
                       *(mzd_local_t **)((long)&rounds[0].constant + lVar10));
      mzd_addmul_v_s256_192
                ((mzd_local_t *)local_100,local_128,
                 *(mzd_local_t **)((long)&rounds[0].k_matrix + lVar10));
      lVar10 = lVar10 + 0x20;
    } while (lVar10 != 0x80);
  }
  else {
    if (uVar4 != 0xff0055) {
      mzd_xor_s256_256(&local_160,x,precomputed_constant_linear_part);
      plVar11 = rounds;
      mzd_addmul_v_s256_256(&local_160,key,precomputed_round_key_matrix_linear_part);
      mzd_mul_v_s256_256_1280
                ((mzd_local_t *)local_100,key,precomputed_round_key_matrix_non_linear_part);
      mzd_xor_s256_1280((mzd_local_t *)local_100,(mzd_local_t *)local_100,
                        precomputed_constant_non_linear_part);
      lVar10 = 0;
      uVar12 = 0;
      do {
        mzd_copy_s256_256((mzd_local_t *)((long)state->state[0].w64 + lVar10),&local_160);
        uVar5 = local_160.w64[3] * 4;
        uVar6 = local_160.w64[3] * 2 & 0x9249249000000000;
        uVar9 = local_160.w64[3] & 0x9249249000000000;
        local_160.w64[3] =
             *(long *)(local_100 + (ulong)((uint)uVar12 & 6) * 4 + (uVar12 >> 3 & 0x1fffffff) * 0x20
                      ) << (~(byte)lVar10 & 0x20) & 0xffffffff00000000U ^
             (uVar6 ^ 0x9249249000000000) & uVar5 ^ uVar9 ^ uVar6 ^
             (((uVar9 ^ 0x9249249000000000) & uVar5 ^ uVar6) >> 1 |
             (local_160.w64[3] * 2 & uVar9 ^ uVar5 & 0x9249249000000000) >> 2 |
             local_160.w64[3] & 0x3ffffffff);
        mzd_mul_v_parity_s256_256_30(&local_120,&local_160,plVar11->z_matrix);
        mzd_shuffle_pext_256_30(&local_160,plVar11->r_mask);
        mzd_addmul_v_s256_30_256(&local_120,&local_160,plVar11->r_matrix);
        local_160.w64[3] = local_160.w64[3] & 0x3ffffffff;
        mzd_xor_s256_256(&local_160,&local_120,&local_160);
        uVar12 = uVar12 + 1;
        plVar11 = plVar11 + 1;
        lVar10 = lVar10 + 0x20;
      } while (uVar12 != 0x25);
      mzd_copy_s256_256(state[0x25].state,&local_160);
      uVar12 = local_160.w64[3] * 4;
      uVar5 = local_160.w64[3] * 2 & 0x9249249000000000;
      uVar6 = local_160.w64[3] & 0x9249249000000000;
      local_160.w64[3] =
           local_70 & 0xffffffff00000000 ^
           (uVar5 ^ 0x9249249000000000) & uVar12 ^ uVar6 ^ uVar5 ^
           (((uVar6 ^ 0x9249249000000000) & uVar12 ^ uVar5) >> 1 |
           (local_160.w64[3] * 2 & uVar6 ^ uVar12 & 0x9249249000000000) >> 2 |
           local_160.w64[3] & 0x3ffffffff);
      mzd_mul_v_s256_256(&local_120,&local_160,Z_r);
      mzd_copy_s256_256(&local_160,&local_120);
      prVar7 = state + 0x26;
      goto LAB_0010776c;
    }
    mzd_copy_s256_256((mzd_local_t *)local_100,x);
    mzd_addmul_v_s256_256((mzd_local_t *)local_100,key,K_0);
    lVar10 = 0;
    local_128 = key;
    do {
      mzd_copy_s256_256((mzd_local_t *)((long)state->state[0].w64 + lVar10),(mzd_local_t *)local_100
                       );
      auVar20 = vpand_avx2(local_100._0_32_,_DAT_0010d760);
      auVar21 = vpand_avx2(local_100._0_32_,_DAT_0010d780);
      auVar3 = vpand_avx2(local_100._0_32_,_DAT_0010d7a0);
      auVar22 = vpsllq_avx2(auVar20,2);
      auVar20 = vpsrlq_avx2(auVar20,0x3e);
      auVar20 = vpermq_avx2(auVar20,0x93);
      auVar22 = vpor_avx2(auVar20,auVar22);
      auVar20 = vpaddq_avx2(auVar21,auVar21);
      auVar21 = vpsrlq_avx2(auVar21,0x3f);
      auVar21 = vpermq_avx2(auVar21,0x93);
      auVar21 = vpor_avx2(auVar21,auVar20);
      auVar20 = vpand_avx2(auVar22,auVar3);
      auVar18 = vpternlogq_avx512vl(auVar20,auVar21,auVar22,0x96);
      auVar20 = vpor_avx2(auVar22,auVar21);
      auVar21 = vpternlogq_avx512vl(auVar22,auVar21,auVar3,0x78);
      auVar22 = vpsrlq_avx2(auVar21,2);
      auVar21 = vpsllq_avx2(auVar21,0x3e);
      auVar21 = vpermq_avx2(auVar21,0x39);
      auVar21 = vpternlogq_avx512vl(auVar21,auVar20,auVar22,0x36);
      auVar22 = vpsrlq_avx2(auVar18,1);
      auVar20 = vpsllq_avx2(auVar18,0x3f);
      auVar20 = vpermq_avx2(auVar20,0x39);
      auVar20 = vpor_avx2(auVar20,auVar22);
      local_100._0_32_ = vpternlogq_avx512vl(auVar20,auVar3,auVar21,0x96);
      mzd_mul_v_s256_256(&local_160,(mzd_local_t *)local_100,
                         *(mzd_local_t **)((long)&rounds[0].l_matrix + lVar10));
      mzd_xor_s256_256((mzd_local_t *)local_100,&local_160,
                       *(mzd_local_t **)((long)&rounds[0].constant + lVar10));
      mzd_addmul_v_s256_256
                ((mzd_local_t *)local_100,local_128,
                 *(mzd_local_t **)((long)&rounds[0].k_matrix + lVar10));
      lVar10 = lVar10 + 0x20;
    } while (lVar10 != 0x80);
  }
  prVar7 = state + 4;
  pmVar8 = (mzd_local_t *)local_100;
LAB_00107772:
  mzd_copy_s256_256(prVar7->state,pmVar8);
  return;
}

Assistant:

void lowmc_record_state(const lowmc_parameters_t* lowmc, const lowmc_key_t* key,
                        const mzd_local_t* x, recorded_state_t* state) {
  const uint32_t lowmc_id = lowmc_get_id(lowmc);
#if defined(WITH_OPT)
#if defined(WITH_AVX2)
  /* AVX2 enabled instances */
  if (CPU_SUPPORTS_AVX2) {
    switch (lowmc_id) {
      /* Instances with partial Sbox layer */
#if defined(WITH_LOWMC_128_128_20)
    case LOWMC_ID(128, 10):
      lowmc_store_s256_lowmc_128_128_20(key, x, state);
      return;
#endif
#if defined(WITH_LOWMC_192_192_30)
    case LOWMC_ID(192, 10):
      lowmc_store_s256_lowmc_192_192_30(key, x, state);
      return;
#endif
#if defined(WITH_LOWMC_256_256_38)
    case LOWMC_ID(256, 10):
      lowmc_store_s256_lowmc_256_256_38(key, x, state);
      return;
#endif
      /* Instances with full Sbox layer */
#if defined(WITH_LOWMC_129_129_4)
    case LOWMC_ID(129, 43):
      lowmc_store_s256_lowmc_129_129_4(key, x, state);
      return;
#endif
#if defined(WITH_LOWMC_192_192_4)
    case LOWMC_ID(192, 64):
      lowmc_store_s256_lowmc_192_192_4(key, x, state);
      return;
#endif
#if defined(WITH_LOWMC_255_255_4)
    case LOWMC_ID(255, 85):
      lowmc_store_s256_lowmc_255_255_4(key, x, state);
      return;
#endif
    }
  }
#endif

#if defined(WITH_SSE2) || defined(WITH_NEON)
  /* SSE2/NEON enabled instances */
  if (CPU_SUPPORTS_SSE2 || CPU_SUPPORTS_NEON) {
    switch (lowmc_id) {
      /* Instances with partial Sbox layer */
#if defined(WITH_LOWMC_128_128_20)
    case LOWMC_ID(128, 10):
      lowmc_store_s128_lowmc_128_128_20(key, x, state);
      return;
#endif
#if defined(WITH_LOWMC_192_192_30)
    case LOWMC_ID(192, 10):
      lowmc_store_s128_lowmc_192_192_30(key, x, state);
      return;
#endif
#if defined(WITH_LOWMC_256_256_38)
    case LOWMC_ID(256, 10):
      lowmc_store_s128_lowmc_256_256_38(key, x, state);
      return;
#endif
      /* Instances with full Sbox layer */
#if defined(WITH_LOWMC_129_129_4)
    case LOWMC_ID(129, 43):
      lowmc_store_s128_lowmc_129_129_4(key, x, state);
      return;
#endif
#if defined(WITH_LOWMC_192_192_4)
    case LOWMC_ID(192, 64):
      lowmc_store_s128_lowmc_192_192_4(key, x, state);
      return;
#endif
#if defined(WITH_LOWMC_255_255_4)
    case LOWMC_ID(255, 85):
      lowmc_store_s128_lowmc_255_255_4(key, x, state);
      return;
#endif
    }
  }
#endif
#endif

#if !defined(NO_UINT64_FALLBACK)
  /* uint64_t implementations */
  switch (lowmc_id) {
    /* Instances with partial Sbox layer */
#if defined(WITH_LOWMC_128_128_20)
  case LOWMC_ID(128, 10):
    lowmc_store_uint64_lowmc_128_128_20(key, x, state);
    return;
#endif
#if defined(WITH_LOWMC_192_192_30)
  case LOWMC_ID(192, 10):
    lowmc_store_uint64_lowmc_192_192_30(key, x, state);
    return;
#endif
#if defined(WITH_LOWMC_256_256_38)
  case LOWMC_ID(256, 10):
    lowmc_store_uint64_lowmc_256_256_38(key, x, state);
    return;
#endif
    /* Instances with full Sbox layer */
#if defined(WITH_LOWMC_129_129_4)
  case LOWMC_ID(129, 43):
    lowmc_store_uint64_lowmc_129_129_4(key, x, state);
    return;
#endif
#if defined(WITH_LOWMC_192_192_4)
  case LOWMC_ID(192, 64):
    lowmc_store_uint64_lowmc_192_192_4(key, x, state);
    return;
#endif
#if defined(WITH_LOWMC_255_255_4)
  case LOWMC_ID(255, 85):
    lowmc_store_uint64_lowmc_255_255_4(key, x, state);
    return;
#endif
  }
#endif

  UNREACHABLE;
}